

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O2

void Ssw_SmlAddPatternDyn(Ssw_Man_t *p)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  Aig_Obj_t *pObj;
  void *pvVar4;
  int i;
  
  i = 0;
  while( true ) {
    pVVar2 = p->pMSat->vUsedPis;
    if (pVVar2->nSize <= i) {
      return;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(pVVar2,i);
    if ((*(uint *)&pObj->field_0x18 & 7) != 2) break;
    iVar3 = Ssw_ObjSatNum(p->pMSat,pObj);
    if (iVar3 < 1) {
      __assert_fail("nVarNum > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSweep.c"
                    ,0xa7,"void Ssw_SmlAddPatternDyn(Ssw_Man_t *)");
    }
    iVar3 = sat_solver_var_value(p->pMSat->pSat,iVar3);
    if (iVar3 != 0) {
      pVVar2 = p->vSimInfo;
      iVar3 = Aig_ObjCioId(pObj);
      pvVar4 = Vec_PtrEntry(pVVar2,iVar3);
      puVar1 = (uint *)((long)pvVar4 + (long)(p->nPatterns >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)p->nPatterns & 0x1f);
    }
    i = i + 1;
  }
  __assert_fail("Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSweep.c"
                ,0xa5,"void Ssw_SmlAddPatternDyn(Ssw_Man_t *)");
}

Assistant:

void Ssw_SmlAddPatternDyn( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj;
    unsigned * pInfo;
    int i, nVarNum;
    // iterate through the PIs of the frames
    Vec_PtrForEachEntry( Aig_Obj_t *, p->pMSat->vUsedPis, pObj, i )
    {
        assert( Aig_ObjIsCi(pObj) );
        nVarNum = Ssw_ObjSatNum( p->pMSat, pObj );
        assert( nVarNum > 0 );
        if ( sat_solver_var_value( p->pMSat->pSat, nVarNum ) )
        {
            pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObj) );
            Abc_InfoSetBit( pInfo, p->nPatterns );
        }
    }
}